

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SMDLoader.cpp
# Opt level: O0

bool __thiscall
Assimp::SMDImporter::ParseUnsignedInt
          (SMDImporter *this,char *szCurrent,char **szCurrentOut,uint *out)

{
  bool bVar1;
  uint uVar2;
  uint *out_local;
  char **szCurrentOut_local;
  char *szCurrent_local;
  SMDImporter *this_local;
  
  szCurrentOut_local = (char **)szCurrent;
  szCurrent_local = (char *)this;
  bVar1 = SkipSpaces<char>((char **)&szCurrentOut_local);
  if (bVar1) {
    uVar2 = strtoul10((char *)szCurrentOut_local,szCurrentOut);
    *out = uVar2;
  }
  return bVar1;
}

Assistant:

bool SMDImporter::ParseUnsignedInt(const char* szCurrent, const char** szCurrentOut, unsigned int& out) {
    if(!SkipSpaces(&szCurrent)) {
        return false;
    }

    out = strtoul10(szCurrent,szCurrentOut);
    return true;
}